

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O3

bool parse_options(int argc,char **argv,Options *options)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *pcVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  string line;
  ifstream f;
  value_type local_260;
  string *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [16];
  
  if (1 < argc) {
    this = &options->parse_files;
    paVar1 = &local_238[0].field_2;
    local_240 = &options->print;
    iVar9 = 1;
    do {
      pcVar10 = argv[iVar9];
      sVar2 = (options->command)._M_string_length;
      if (*pcVar10 == '-') {
        if (sVar2 == 0) {
          bVar4 = false;
          std::__cxx11::string::_M_replace((ulong)options,0,(char *)0x0,0x111186);
          pcVar10 = argv[iVar9];
          if (*pcVar10 == '-') goto LAB_00104228;
        }
        else {
LAB_00104228:
          bVar4 = true;
          if ((pcVar10[1] == 'h') && (pcVar10[2] == '\0')) {
            printf("%s [-h] [directory | files.cpp]",*argv);
            return false;
          }
        }
        iVar6 = strcmp(pcVar10,"-filelist");
        if (iVar6 == 0) {
          iVar9 = iVar9 + 1;
          if (iVar9 < argc) {
            std::ifstream::ifstream(local_238,argv[iVar9],_S_in);
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            local_260._M_string_length = 0;
            local_260.field_2._M_local_buf[0] = '\0';
            while( true ) {
              cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0]._M_dataplus._M_p + -0x18) +
                                      (char)local_238);
              piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)local_238,(string *)&local_260,cVar5);
              if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(this,&local_260);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,
                              CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                       local_260.field_2._M_local_buf[0]) + 1);
            }
            std::ifstream::~ifstream(local_238);
          }
        }
        else {
          iVar6 = strcmp(pcVar10,"-print");
          if (iVar6 == 0) {
            iVar9 = iVar9 + 1;
            if (iVar9 < argc) {
              pcVar10 = argv[iVar9];
              pcVar3 = (char *)(options->print)._M_string_length;
              strlen(pcVar10);
              std::__cxx11::string::_M_replace((ulong)local_240,0,pcVar3,(ulong)pcVar10);
            }
          }
          else {
            iVar6 = strcmp(pcVar10,"-showtime");
            if (iVar6 == 0) {
              options->show_time = true;
            }
            else {
              iVar6 = strcmp(pcVar10,"-showtokens");
              if (iVar6 == 0) {
                options->show_tokens = true;
              }
              else {
                iVar6 = strcmp(pcVar10,"-showast");
                if (iVar6 == 0) {
                  options->show_ast = true;
                }
                else {
                  iVar6 = strcmp(pcVar10,"-showincludes");
                  if (iVar6 == 0) {
                    options->show_includes = true;
                  }
                  else {
                    iVar6 = strcmp(pcVar10,"-showfunctions");
                    if (iVar6 == 0) {
                      options->show_functions = true;
                    }
                    else {
                      iVar6 = strcmp(pcVar10,"-counttokens");
                      if (iVar6 == 0) {
                        options->count_tokens = true;
                      }
                      else {
                        iVar6 = strcmp(pcVar10,"-countlines");
                        if (iVar6 == 0) {
                          options->count_lines = true;
                        }
                        else {
                          iVar6 = strcmp(pcVar10,"-keywordstats");
                          if (iVar6 == 0) {
                            options->keyword_stats = true;
                          }
                          else {
                            iVar6 = strcmp(pcVar10,"-threads");
                            if (iVar6 == 0) {
                              iVar9 = iVar9 + 1;
                              if (iVar9 < argc) {
                                lVar8 = strtol(argv[iVar9],(char **)0x0,10);
                                options->threads = (int)lVar8;
                              }
                            }
                            else {
                              if (((!bVar4) || (pcVar10[1] != '-')) || (pcVar10[2] != '\0')) {
                                printf("%s: invalid argument %s\n",*argv,pcVar10);
                                return false;
                              }
                              local_238[0]._M_string_length = 0;
                              local_238[0].field_2._M_local_buf[0] = '\0';
                              local_238[0]._M_dataplus._M_p = (pointer)paVar1;
                              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                              ::emplace_back<std::__cxx11::string>
                                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                          *)this,local_238);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_238[0]._M_dataplus._M_p != paVar1) {
                                operator_delete(local_238[0]._M_dataplus._M_p,
                                                CONCAT71(local_238[0].field_2._M_allocated_capacity.
                                                         _1_7_,local_238[0].field_2._M_local_buf[0])
                                                + 1);
                              }
                              iVar9 = iVar9 + 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else if (sVar2 == 0) {
        strlen(pcVar10);
        std::__cxx11::string::_M_replace((ulong)options,0,(char *)0x0,(ulong)pcVar10);
      }
      else {
        std::__cxx11::string::string((string *)local_238,pcVar10,(allocator *)&local_260);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                   local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_238[0]._M_dataplus._M_p,
                          CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                   local_238[0].field_2._M_local_buf[0]) + 1);
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < argc);
  }
  return true;
}

Assistant:

bool parse_options(int argc, char* argv[], Options& options)
{
  for (int i=1; i<argc; ++i) {
    // Ignore empty args?
    if (argv[i][0] != '-') {
      if (options.command.empty())
        options.command = argv[i];
      else
        options.parse_files.push_back(argv[i]);
      continue;
    }
    else if (options.command.empty()) {
      options.command = "none";
    }

    if (std::strcmp(argv[i], "-h") == 0) {
      std::printf("%s [-h] [directory | files.cpp]",
                  argv[0]);
      return false;
    }
    else if (std::strcmp(argv[i], "-filelist") == 0) {
      ++i;
      if (i < argc) {
        std::ifstream f(argv[i]);
        std::string line;
        while (std::getline(f, line)) {
          options.parse_files.push_back(line);
        }
      }
    }
    else if (std::strcmp(argv[i], "-print") == 0) {
      ++i;
      if (i < argc) {
        options.print = argv[i];
      }
    }
    else if (std::strcmp(argv[i], "-showtime") == 0) {
      options.show_time = true;
    }
    else if (std::strcmp(argv[i], "-showtokens") == 0) {
      options.show_tokens = true;
    }
    else if (std::strcmp(argv[i], "-showast") == 0) {
      options.show_ast = true;
    }
    else if (std::strcmp(argv[i], "-showincludes") == 0) {
      options.show_includes = true;
    }
    else if (std::strcmp(argv[i], "-showfunctions") == 0) {
      options.show_functions = true;
    }
    else if (std::strcmp(argv[i], "-counttokens") == 0) {
      options.count_tokens = true;
    }
    else if (std::strcmp(argv[i], "-countlines") == 0) {
      options.count_lines = true;
    }
    else if (std::strcmp(argv[i], "-keywordstats") == 0) {
      options.keyword_stats = true;
    }
    else if (std::strcmp(argv[i], "-threads") == 0) {
      ++i;
      if (i < argc) {
        options.threads = std::strtol(argv[i], nullptr, 10);
      }
    }
    else if (std::strcmp(argv[i], "--") == 0) {
      ++i;
      options.parse_files.push_back(std::string()); // parse stdin
    }
    else {
      std::printf("%s: invalid argument %s\n", argv[0], argv[i]);
      return false;
    }
  }
  return true;
}